

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_lstore_1(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  ValueType VStack_2c;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  VStack_2c = VVar1.type;
  if (VStack_2c != LONG) {
    __assert_fail("value.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x545,"void ExecutionEngine::i_lstore_1()");
  }
  Frame::changeLocalVariable(this_01,VVar1,1);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  VStack_2c = VVar1.type;
  if (VStack_2c == PADDING) {
    Frame::changeLocalVariable(this_01,VVar1,2);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::PADDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x549,"void ExecutionEngine::i_lstore_1()");
}

Assistant:

void ExecutionEngine::i_lstore_1() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::LONG);
    topFrame->changeLocalVariable(value, 1);

    value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::PADDING);
    topFrame->changeLocalVariable(value, 2);

    topFrame->pc += 1;
}